

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O0

void anon_unknown.dwarf_13b32::verifyPixelsAreEqual<float>
               (DeepImageChannel *c1,DeepImageChannel *c2,int dx,int dy)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  SampleCountChannel *pSVar4;
  long lVar5;
  ImageLevel *this;
  Box2i *pBVar6;
  DeepImageLevel *pDVar7;
  uint *puVar8;
  ArgExc *pAVar9;
  long lVar10;
  long lVar11;
  int in_EDX;
  undefined8 in_RSI;
  ImageChannel *in_RDI;
  int i;
  float *s2;
  float *s1;
  int n2;
  int n1;
  int x;
  int y;
  SampleCountChannel *scc2;
  SampleCountChannel *scc1;
  Box2i *dataWindow;
  TypedDeepImageChannel<float> *tc2;
  TypedDeepImageChannel<float> *tc1;
  long lVar12;
  SampleCountChannel *this_00;
  int local_74;
  int local_48;
  int local_44;
  
  pSVar4 = (SampleCountChannel *)
           __dynamic_cast(in_RDI,&Imf_3_4::DeepImageChannel::typeinfo,
                          &Imf_3_4::TypedDeepImageChannel<float>::typeinfo,0);
  if (pSVar4 == (SampleCountChannel *)0x0) {
    __cxa_bad_cast();
  }
  this_00 = pSVar4;
  lVar5 = __dynamic_cast(in_RSI,&Imf_3_4::DeepImageChannel::typeinfo,
                         &Imf_3_4::TypedDeepImageChannel<float>::typeinfo,0);
  if (lVar5 == 0) {
    __cxa_bad_cast();
  }
  lVar12 = lVar5;
  this = Imf_3_4::ImageChannel::level(in_RDI);
  pBVar6 = Imf_3_4::ImageLevel::dataWindow(this);
  pDVar7 = (DeepImageLevel *)Imf_3_4::DeepImageChannel::deepLevel();
  Imf_3_4::DeepImageLevel::sampleCounts(pDVar7);
  pDVar7 = (DeepImageLevel *)Imf_3_4::DeepImageChannel::deepLevel();
  Imf_3_4::DeepImageLevel::sampleCounts(pDVar7);
  local_44 = (pBVar6->min).y;
  do {
    if ((pBVar6->max).y < local_44) {
      return;
    }
    for (local_48 = (pBVar6->min).x; local_48 <= (pBVar6->max).x; local_48 = local_48 + 1) {
      puVar8 = Imf_3_4::SampleCountChannel::at(this_00,(int)((ulong)lVar12 >> 0x20),(int)lVar12);
      uVar3 = *puVar8;
      puVar8 = Imf_3_4::SampleCountChannel::at(this_00,(int)((ulong)lVar12 >> 0x20),(int)lVar12);
      if (uVar3 != *puVar8) {
        pAVar9 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar9,"different pixel sample counts");
        __cxa_throw(pAVar9,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      lVar10 = Imf_3_4::TypedDeepImageChannel<float>::at((int)pSVar4,local_48);
      lVar11 = Imf_3_4::TypedDeepImageChannel<float>::at((int)lVar5,local_48 + in_EDX);
      for (local_74 = 0; local_74 < (int)uVar3; local_74 = local_74 + 1) {
        fVar2 = *(float *)(lVar10 + (long)local_74 * 4);
        pfVar1 = (float *)(lVar11 + (long)local_74 * 4);
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
          pAVar9 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(pAVar9,"different sample values");
          __cxa_throw(pAVar9,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
      }
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

void
verifyPixelsAreEqual (
    const DeepImageChannel& c1, const DeepImageChannel& c2, int dx, int dy)
{
    const TypedDeepImageChannel<T>& tc1 =
        dynamic_cast<const TypedDeepImageChannel<T>&> (c1);

    const TypedDeepImageChannel<T>& tc2 =
        dynamic_cast<const TypedDeepImageChannel<T>&> (c2);

    const Box2i&              dataWindow = c1.level ().dataWindow ();
    const SampleCountChannel& scc1       = c1.deepLevel ().sampleCounts ();
    const SampleCountChannel& scc2       = c2.deepLevel ().sampleCounts ();

    for (int y = dataWindow.min.y; y <= dataWindow.max.y; ++y)
    {
        for (int x = dataWindow.min.x; x <= dataWindow.max.x; ++x)
        {
            int n1 = scc1.at (x, y);
            int n2 = scc2.at (x + dx, y + dy);

            if (n1 != n2) throw ArgExc ("different pixel sample counts");

            const T* s1 = tc1.at (x, y);
            const T* s2 = tc2.at (x + dx, y + dy);

            for (int i = 0; i < n1; ++i)
                if (s1[i] != s2[i]) throw ArgExc ("different sample values");
        }
    }
}